

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# direct_lower_upper_factorisation.hpp
# Opt level: O0

bool __thiscall
Disa::Direct_Lower_Upper_Factorisation<(Disa::Solver_Type)0,_0UL,_true>::factorise
          (Direct_Lower_Upper_Factorisation<(Disa::Solver_Type)0,_0UL,_true> *this,
          Matrix_Dense<double,_0UL,_0UL> *a_matrix)

{
  double dVar1;
  double dVar2;
  bool bVar3;
  size_t sVar4;
  Scalar SVar5;
  vector<double,_std::allocator<double>_> *pvVar6;
  reference __a;
  reference __b;
  reference __a_00;
  reference __b_00;
  reference pvVar7;
  Scalar SVar8;
  size_t extraout_XMM0_Qa;
  double extraout_XMM0_Qa_00;
  Scalar local_68;
  size_t i_column_sweep;
  size_t i_row_sweep_1;
  Scalar absA;
  size_t i_row_sweep;
  size_t i_max;
  Scalar max;
  size_t i_row;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  local_28;
  Matrix_Dense<double,_0UL,_0UL> *local_20;
  Matrix_Dense<double,_0UL,_0UL> *a_matrix_local;
  Direct_Lower_Upper_Factorisation<(Disa::Solver_Type)0,_0UL,_true> *this_local;
  
  this->factorised = false;
  local_20 = a_matrix;
  a_matrix_local = (Matrix_Dense<double,_0UL,_0UL> *)this;
  Matrix_Dense<double,_0UL,_0UL>::operator=(&this->lu_factorised,a_matrix);
  sVar4 = Matrix_Dense<double,_0UL,_0UL>::size_column(&this->lu_factorised);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::resize(&this->pivots,sVar4);
  local_28._M_current =
       (unsigned_long *)
       std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin(&this->pivots);
  i_row = (size_t)std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end(&this->pivots);
  std::
  iota<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,int>
            (local_28,(__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                       )i_row,0);
  max = 0.0;
  while( true ) {
    SVar8 = max;
    SVar5 = (Scalar)Matrix_Dense<double,_0UL,_0UL>::size_row(&this->lu_factorised);
    if ((ulong)SVar5 <= (ulong)SVar8) {
      this->factorised = true;
      return true;
    }
    i_max = 0;
    i_row_sweep = (size_t)max;
    for (absA = max; SVar8 = absA,
        SVar5 = (Scalar)Matrix_Dense<double,_0UL,_0UL>::size_column(&this->lu_factorised),
        (ulong)SVar8 < (ulong)SVar5; absA = (Scalar)((long)absA + 1)) {
      pvVar6 = &std::
                vector<Disa::Vector_Dense<double,_0UL>,_std::allocator<Disa::Vector_Dense<double,_0UL>_>_>
                ::operator[](&(this->lu_factorised).
                              super_vector<Disa::Vector_Dense<double,_0UL>,_std::allocator<Disa::Vector_Dense<double,_0UL>_>_>
                             ,(size_type)absA)->super_vector<double,_std::allocator<double>_>;
      std::vector<double,_std::allocator<double>_>::operator[](pvVar6,(size_type)max);
      std::abs((int)pvVar6);
      i_row_sweep_1 = extraout_XMM0_Qa;
      bVar3 = is_nearly_greater((Scalar *)&i_row_sweep_1,(Scalar *)&i_max,
                                (Scalar *)&default_relative,(Scalar *)&default_absolute);
      if (bVar3) {
        i_max = i_row_sweep_1;
        i_row_sweep = (size_t)absA;
      }
    }
    if ((Scalar)i_row_sweep != max) {
      __a = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                      (&this->pivots,(size_type)max);
      __b = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                      (&this->pivots,i_row_sweep);
      std::swap<unsigned_long>(__a,__b);
      __a_00 = std::
               vector<Disa::Vector_Dense<double,_0UL>,_std::allocator<Disa::Vector_Dense<double,_0UL>_>_>
               ::operator[](&(this->lu_factorised).
                             super_vector<Disa::Vector_Dense<double,_0UL>,_std::allocator<Disa::Vector_Dense<double,_0UL>_>_>
                            ,(size_type)max);
      __b_00 = std::
               vector<Disa::Vector_Dense<double,_0UL>,_std::allocator<Disa::Vector_Dense<double,_0UL>_>_>
               ::operator[](&(this->lu_factorised).
                             super_vector<Disa::Vector_Dense<double,_0UL>,_std::allocator<Disa::Vector_Dense<double,_0UL>_>_>
                            ,i_row_sweep);
      std::swap<Disa::Vector_Dense<double,0ul>>(__a_00,__b_00);
    }
    pvVar6 = &std::
              vector<Disa::Vector_Dense<double,_0UL>,_std::allocator<Disa::Vector_Dense<double,_0UL>_>_>
              ::operator[](&(this->lu_factorised).
                            super_vector<Disa::Vector_Dense<double,_0UL>,_std::allocator<Disa::Vector_Dense<double,_0UL>_>_>
                           ,(size_type)max)->super_vector<double,_std::allocator<double>_>;
    std::vector<double,_std::allocator<double>_>::operator[](pvVar6,(size_type)max);
    std::abs((int)pvVar6);
    i_column_sweep = (size_t)max;
    if (extraout_XMM0_Qa_00 < this->factorisation_tolerance) break;
    while( true ) {
      i_column_sweep = i_column_sweep + 1;
      sVar4 = Matrix_Dense<double,_0UL,_0UL>::size_row(&this->lu_factorised);
      if (sVar4 <= i_column_sweep) break;
      pvVar6 = &std::
                vector<Disa::Vector_Dense<double,_0UL>,_std::allocator<Disa::Vector_Dense<double,_0UL>_>_>
                ::operator[](&(this->lu_factorised).
                              super_vector<Disa::Vector_Dense<double,_0UL>,_std::allocator<Disa::Vector_Dense<double,_0UL>_>_>
                             ,(size_type)max)->super_vector<double,_std::allocator<double>_>;
      pvVar7 = std::vector<double,_std::allocator<double>_>::operator[](pvVar6,(size_type)max);
      dVar1 = *pvVar7;
      pvVar6 = &std::
                vector<Disa::Vector_Dense<double,_0UL>,_std::allocator<Disa::Vector_Dense<double,_0UL>_>_>
                ::operator[](&(this->lu_factorised).
                              super_vector<Disa::Vector_Dense<double,_0UL>,_std::allocator<Disa::Vector_Dense<double,_0UL>_>_>
                             ,i_column_sweep)->super_vector<double,_std::allocator<double>_>;
      pvVar7 = std::vector<double,_std::allocator<double>_>::operator[](pvVar6,(size_type)max);
      *pvVar7 = *pvVar7 / dVar1;
      local_68 = max;
      while( true ) {
        local_68 = (Scalar)((long)local_68 + 1);
        SVar8 = (Scalar)Matrix_Dense<double,_0UL,_0UL>::size_column(&this->lu_factorised);
        if ((ulong)SVar8 <= (ulong)local_68) break;
        pvVar6 = &std::
                  vector<Disa::Vector_Dense<double,_0UL>,_std::allocator<Disa::Vector_Dense<double,_0UL>_>_>
                  ::operator[](&(this->lu_factorised).
                                super_vector<Disa::Vector_Dense<double,_0UL>,_std::allocator<Disa::Vector_Dense<double,_0UL>_>_>
                               ,i_column_sweep)->super_vector<double,_std::allocator<double>_>;
        pvVar7 = std::vector<double,_std::allocator<double>_>::operator[](pvVar6,(size_type)max);
        dVar1 = *pvVar7;
        pvVar6 = &std::
                  vector<Disa::Vector_Dense<double,_0UL>,_std::allocator<Disa::Vector_Dense<double,_0UL>_>_>
                  ::operator[](&(this->lu_factorised).
                                super_vector<Disa::Vector_Dense<double,_0UL>,_std::allocator<Disa::Vector_Dense<double,_0UL>_>_>
                               ,(size_type)max)->super_vector<double,_std::allocator<double>_>;
        pvVar7 = std::vector<double,_std::allocator<double>_>::operator[]
                           (pvVar6,(size_type)local_68);
        dVar2 = *pvVar7;
        pvVar6 = &std::
                  vector<Disa::Vector_Dense<double,_0UL>,_std::allocator<Disa::Vector_Dense<double,_0UL>_>_>
                  ::operator[](&(this->lu_factorised).
                                super_vector<Disa::Vector_Dense<double,_0UL>,_std::allocator<Disa::Vector_Dense<double,_0UL>_>_>
                               ,i_column_sweep)->super_vector<double,_std::allocator<double>_>;
        pvVar7 = std::vector<double,_std::allocator<double>_>::operator[]
                           (pvVar6,(size_type)local_68);
        *pvVar7 = -dVar1 * dVar2 + *pvVar7;
      }
    }
    max = (Scalar)((long)max + 1);
  }
  return false;
}

Assistant:

bool Direct_Lower_Upper_Factorisation<_solver_type, _size, _pivot>::factorise(
const Matrix_Dense<Scalar, _size, _size>& a_matrix) {

  // Initialise factorisation data.
  factorised = false;
  lu_factorised = a_matrix;
  if(_pivot) {
    pivots.resize(lu_factorised.size_column());
    std::iota(pivots.begin(), pivots.end(), 0);
  }

  // Factorise A into L and U.
  for(std::size_t i_row = 0; i_row < lu_factorised.size_row(); ++i_row) {

    // Pivoting
    if(_pivot) {

      // Find largest remaining column value to pivot on.
      Scalar max = 0.0;
      std::size_t i_max = i_row;
      for(std::size_t i_row_sweep = i_row; i_row_sweep < lu_factorised.size_column(); ++i_row_sweep) {
        const Scalar absA = std::abs(lu_factorised[i_row_sweep][i_row]);
        if(is_nearly_greater(absA, max)) {
          max = absA;
          i_max = i_row_sweep;
        }
      }

      // Pivot if larger value found.
      if(i_max != i_row) {
        std::swap(pivots[i_row], pivots[i_max]);
        std::swap(lu_factorised[i_row], lu_factorised[i_max]);
      }
    }

    // Check degeneracy.
    if(std::abs(lu_factorised[i_row][i_row]) < factorisation_tolerance) return false;

    // Decomposition, actual factorisation to compute L and U.
    for(std::size_t i_row_sweep = i_row + 1; i_row_sweep < lu_factorised.size_row(); ++i_row_sweep) {
      lu_factorised[i_row_sweep][i_row] /= lu_factorised[i_row][i_row];

      for(std::size_t i_column_sweep = i_row + 1; i_column_sweep < lu_factorised.size_column(); ++i_column_sweep)
        lu_factorised[i_row_sweep][i_column_sweep] -=
        lu_factorised[i_row_sweep][i_row] * lu_factorised[i_row][i_column_sweep];
    }
  }

  factorised = true;
  return true;
}